

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

void __thiscall cppwinrt::type_name::type_name(type_name *this,TypeDef *type)

{
  string_view sVar1;
  TypeDef *type_local;
  type_name *this_local;
  
  sVar1 = winmd::reader::TypeDef::TypeName(type);
  this->name = sVar1;
  sVar1 = winmd::reader::TypeDef::TypeNamespace(type);
  this->name_space = sVar1;
  return;
}

Assistant:

explicit type_name(TypeDef const& type) :
            name(type.TypeName()),
            name_space(type.TypeNamespace())
        {
        }